

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

RepeatedField<float> * __thiscall
google::protobuf::RepeatedField<float>::operator=
          (RepeatedField<float> *this,RepeatedField<float> *other)

{
  if (this != other) {
    CopyFrom(this,other);
  }
  return this;
}

Assistant:

inline RepeatedField<Element>& RepeatedField<Element>::operator=(
    const RepeatedField& other) {
  if (this != &other) CopyFrom(other);
  return *this;
}